

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::VideoTrack::Seek(VideoTrack *this,longlong time_ns,BlockEntry **pResult)

{
  Cluster **ppCVar1;
  Cluster *pCluster;
  Segment *pSVar2;
  undefined1 auVar3 [16];
  Cluster **ppCVar4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  longlong lVar7;
  BlockEntry *pBVar8;
  Cluster **ppCVar9;
  Cluster **ppCVar10;
  
  lVar6 = Track::GetFirst(&this->super_Track,pResult);
  if (-1 < lVar6) {
    iVar5 = (*(*pResult)->_vptr_BlockEntry[3])();
    if (iVar5 != 0) {
      pCluster = (*pResult)->m_pCluster;
      iVar5 = (*(*pResult)->_vptr_BlockEntry[2])();
      lVar7 = Block::GetTime((Block *)CONCAT44(extraout_var,iVar5),pCluster);
      if (lVar7 < time_ns) {
        pSVar2 = (this->super_Track).m_pSegment;
        ppCVar10 = pSVar2->m_clusters;
        ppCVar1 = ppCVar10 + pCluster->m_index;
        ppCVar4 = ppCVar1;
        ppCVar10 = ppCVar10 + pSVar2->m_clusterCount;
        while (ppCVar9 = ppCVar4, ppCVar9 < ppCVar10) {
          auVar3._8_8_ = (long)ppCVar10 - (long)ppCVar9 >> 0x3f;
          auVar3._0_8_ = (long)ppCVar10 - (long)ppCVar9 >> 3;
          lVar6 = SUB168(auVar3 / SEXT816(2),0);
          lVar7 = Cluster::GetTime(ppCVar9[lVar6]);
          ppCVar4 = ppCVar9 + lVar6 + 1;
          if (time_ns < lVar7) {
            ppCVar4 = ppCVar9;
            ppCVar10 = ppCVar9 + lVar6;
          }
        }
        pBVar8 = Cluster::GetEntry(ppCVar9[-1],&this->super_Track,time_ns);
        *pResult = pBVar8;
        if ((pBVar8 == (BlockEntry *)0x0) ||
           (iVar5 = (*pBVar8->_vptr_BlockEntry[3])(pBVar8), iVar5 == 0)) {
          ppCVar9 = ppCVar9 + -1;
          while (ppCVar9 != ppCVar1) {
            ppCVar10 = ppCVar9 + -1;
            ppCVar9 = ppCVar9 + -1;
            pBVar8 = Cluster::GetEntry(*ppCVar10,&this->super_Track,time_ns);
            *pResult = pBVar8;
            if ((pBVar8 != (BlockEntry *)0x0) &&
               (iVar5 = (*pBVar8->_vptr_BlockEntry[3])(pBVar8), iVar5 != 0)) {
              return 0;
            }
          }
          *pResult = &(this->super_Track).m_eos.super_BlockEntry;
        }
      }
    }
    lVar6 = 0;
  }
  return lVar6;
}

Assistant:

long VideoTrack::Seek(long long time_ns, const BlockEntry*& pResult) const {
  const long status = GetFirst(pResult);

  if (status < 0)  // buffer underflow, etc
    return status;

  assert(pResult);

  if (pResult->EOS())
    return 0;

  const Cluster* pCluster = pResult->GetCluster();
  assert(pCluster);
  assert(pCluster->GetIndex() >= 0);

  if (time_ns <= pResult->GetBlock()->GetTime(pCluster))
    return 0;

  Cluster** const clusters = m_pSegment->m_clusters;
  assert(clusters);

  const long count = m_pSegment->GetCount();  // loaded only, not pre-loaded
  assert(count > 0);

  Cluster** const i = clusters + pCluster->GetIndex();
  assert(i);
  assert(*i == pCluster);
  assert(pCluster->GetTime() <= time_ns);

  Cluster** const j = clusters + count;

  Cluster** lo = i;
  Cluster** hi = j;

  while (lo < hi) {
    // INVARIANT:
    //[i, lo) <= time_ns
    //[lo, hi) ?
    //[hi, j)  > time_ns

    Cluster** const mid = lo + (hi - lo) / 2;
    assert(mid < hi);

    pCluster = *mid;
    assert(pCluster);
    assert(pCluster->GetIndex() >= 0);
    assert(pCluster->GetIndex() == long(mid - m_pSegment->m_clusters));

    const long long t = pCluster->GetTime();

    if (t <= time_ns)
      lo = mid + 1;
    else
      hi = mid;

    assert(lo <= hi);
  }

  assert(lo == hi);
  assert(lo > i);
  assert(lo <= j);

  pCluster = *--lo;
  assert(pCluster);
  assert(pCluster->GetTime() <= time_ns);

  pResult = pCluster->GetEntry(this, time_ns);

  if ((pResult != 0) && !pResult->EOS())  // found a keyframe
    return 0;

  while (lo != i) {
    pCluster = *--lo;
    assert(pCluster);
    assert(pCluster->GetTime() <= time_ns);

    pResult = pCluster->GetEntry(this, time_ns);

    if ((pResult != 0) && !pResult->EOS())
      return 0;
  }

  // weird: we're on the first cluster, but no keyframe found
  // should never happen but we must return something anyway

  pResult = GetEOS();
  return 0;
}